

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int sign_frommemory(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  undefined8 *puVar1;
  uchar *__s2;
  size_t __n;
  LIBSSH2_HOSTKEY_METHOD *pLVar2;
  _func_int_LIBSSH2_SESSION_ptr_char_ptr_size_t_uchar_ptr_void_ptr_ptr *p_Var3;
  int iVar4;
  uint uVar5;
  LIBSSH2_HOSTKEY_METHOD **ppLVar6;
  void *hostkey_abstract;
  iovec datavec;
  void *local_80;
  uchar *local_78;
  size_t local_70;
  uchar **local_68;
  size_t *local_60;
  size_t local_58;
  char *local_50;
  uchar *local_48;
  iovec local_40;
  
  puVar1 = (undefined8 *)*abstract;
  __s2 = session->userauth_pblc_method;
  __n = session->userauth_pblc_method_len;
  local_48 = (uchar *)*puVar1;
  local_50 = (char *)puVar1[1];
  local_58 = puVar1[2];
  local_78 = data;
  local_70 = data_len;
  local_68 = sig;
  local_60 = sig_len;
  ppLVar6 = libssh2_hostkey_methods();
  local_80 = (void *)0x0;
  pLVar2 = *ppLVar6;
  while (pLVar2 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    ppLVar6 = ppLVar6 + 1;
    if (pLVar2->name == (char *)0x0) break;
    p_Var3 = pLVar2->initPEMFromMemory;
    if ((p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_char_ptr_size_t_uchar_ptr_void_ptr_ptr *)0x0) &&
       (iVar4 = strncmp(pLVar2->name,(char *)__s2,__n), iVar4 == 0)) {
      iVar4 = (*p_Var3)(session,local_50,local_58,local_48,&local_80);
      if ((iVar4 != 0) &&
         (iVar4 = _libssh2_error(session,-0x10,"Unable to initialize private key from memory"),
         iVar4 != 0)) {
        return iVar4;
      }
      local_40.iov_base = local_78;
      local_40.iov_len = local_70;
      iVar4 = (*pLVar2->signv)(session,local_68,local_60,1,&local_40,&local_80);
      if (pLVar2->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*pLVar2->dtor)(session,&local_80);
        return -(uint)(iVar4 != 0);
      }
      return -(uint)(iVar4 != 0);
    }
    pLVar2 = *ppLVar6;
  }
  uVar5 = _libssh2_error(session,-0x11,"No handler for specified private key");
  return -(uint)(uVar5 == 0) | uVar5;
}

Assistant:

static int
sign_frommemory(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    struct privkey_mem *pk_mem = (struct privkey_mem *) (*abstract);
    const LIBSSH2_HOSTKEY_METHOD *privkeyobj;
    void *hostkey_abstract;
    struct iovec datavec;
    int rc;

    rc = memory_read_privatekey(session, &privkeyobj, &hostkey_abstract,
                                session->userauth_pblc_method,
                                session->userauth_pblc_method_len,
                                pk_mem->data,
                                pk_mem->data_len,
                                pk_mem->passphrase);
    if(rc)
        return rc;

    if(!privkeyobj)
        return -1;

    libssh2_prepare_iovec(&datavec, 1);
    datavec.iov_base = (void *)LIBSSH2_UNCONST(data);
    datavec.iov_len  = data_len;

    if(privkeyobj->signv(session, sig, sig_len, 1, &datavec,
                         &hostkey_abstract)) {
        if(privkeyobj->dtor) {
            privkeyobj->dtor(session, &hostkey_abstract);
        }
        return -1;
    }

    if(privkeyobj->dtor) {
        privkeyobj->dtor(session, &hostkey_abstract);
    }
    return 0;
}